

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::on_dynamic_precision<fmt::v6::internal::auto_id>
          (specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
           *this)

{
  unsigned_long_long uVar1;
  error_handler *this_00;
  undefined1 local_61;
  undefined1 *local_60;
  longlong local_58;
  size_t sStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_1
  local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  get_arg(&local_58,this);
  local_38.long_long_value = local_58;
  local_38.string.size = sStack_50;
  local_28 = local_48;
  uStack_20 = uStack_40;
  local_60 = &local_61;
  this_00 = (error_handler *)&local_60;
  uVar1 = visit_format_arg<fmt::v6::internal::precision_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                    ((precision_checker<fmt::v6::internal::error_handler> *)this_00,
                     (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                      *)&local_38.string);
  if ((uVar1 & 0xffffffff80000000) == 0) {
    ((this->super_specs_setter<wchar_t>).specs_)->precision = (int)uVar1;
    return;
  }
  error_handler::on_error(this_00,"number is too big");
}

Assistant:

FMT_CONSTEXPR void on_dynamic_precision(Id arg_id) {
    this->specs_.precision = get_dynamic_spec<precision_checker>(
        get_arg(arg_id), context_.error_handler());
  }